

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall
SetInstance::SetInstance
          (SetInstance *this,string *element_type,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  _Rb_tree_header *p_Var1;
  string *str;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Set","");
  Instance::Instance(&this->super_Instance,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__SetInstance_0016bf20;
  (this->_element_type)._M_dataplus._M_p = (pointer)&(this->_element_type).field_2;
  (this->_element_type)._M_string_length = 0;
  (this->_element_type).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_value)._M_t._M_impl.super__Rb_tree_header;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_value)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)&this->_element_type);
  iVar3 = std::__cxx11::string::compare((char *)message_name);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)message_name);
    if (iVar3 != 0) {
      pcVar5 = "RuntimeError: invalid message.";
      goto LAB_0014a3ee;
    }
  }
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
    bVar2 = Grammar::is_variable(str);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&(this->super_Instance)._name);
      return;
    }
    pcVar5 = "RuntimeError: invalid argument.";
  }
  else {
    pcVar5 = "RuntimeError: wrong number of arguments.";
  }
LAB_0014a3ee:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = pcVar5;
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

SetInstance::SetInstance(const std::string& element_type, const std::string& message_name,
                         const std::vector<std::string>& arguments) : Instance("Set") {
    _element_type = element_type;
    if (message_name == "create:" || message_name == "createIfNotExists:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
    }
    else
        throw EXC_INVALID_MESSAGE;
}